

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs-libc.c
# Opt level: O1

int js_module_set_import_meta(JSContext *ctx,JSValue func_val,int use_realpath,int is_main)

{
  JSAtom atom;
  char *__s;
  char *pcVar1;
  size_t sVar2;
  int iVar3;
  JSValue this_obj;
  JSValue JVar4;
  char buf [4112];
  char local_1048 [4120];
  
  atom = JS_GetModuleName(ctx,(JSModuleDef *)func_val.u.ptr);
  __s = JS_AtomToCString(ctx,atom);
  JS_FreeAtom(ctx,atom);
  iVar3 = -1;
  if (__s != (char *)0x0) {
    pcVar1 = strchr(__s,0x3a);
    if (pcVar1 == (char *)0x0) {
      builtin_strncpy(local_1048,"file://",8);
      if (use_realpath == 0) {
        pstrcat(local_1048,0x1010,__s);
      }
      else {
        sVar2 = strlen(local_1048);
        pcVar1 = realpath(__s,local_1048 + sVar2);
        if (pcVar1 == (char *)0x0) {
          JS_ThrowTypeError(ctx,"realpath failure");
          JS_FreeCString(ctx,__s);
          return -1;
        }
      }
    }
    else {
      pstrcpy(local_1048,0x1010,__s);
    }
    JS_FreeCString(ctx,__s);
    this_obj = JS_GetImportMeta(ctx,(JSModuleDef *)func_val.u.ptr);
    if ((uint)this_obj.tag != 6) {
      JVar4 = JS_NewString(ctx,local_1048);
      JS_DefinePropertyValueStr(ctx,this_obj,"url",JVar4,7);
      JVar4.u._1_7_ = 0;
      JVar4.u.int32._0_1_ = is_main != 0;
      JVar4.tag = 1;
      JS_DefinePropertyValueStr(ctx,this_obj,"main",JVar4,7);
      if ((0xfffffff4 < (uint)this_obj.tag) &&
         (iVar3 = *this_obj.u.ptr, *(int *)this_obj.u.ptr = iVar3 + -1, iVar3 < 2)) {
        __JS_FreeValue(ctx,this_obj);
      }
      iVar3 = 0;
    }
  }
  return iVar3;
}

Assistant:

int js_module_set_import_meta(JSContext *ctx, JSValueConst func_val,
                              JS_BOOL use_realpath, JS_BOOL is_main)
{
    JSModuleDef *m;
    char buf[PATH_MAX + 16];
    JSValue meta_obj;
    JSAtom module_name_atom;
    const char *module_name;
    
    assert(JS_VALUE_GET_TAG(func_val) == JS_TAG_MODULE);
    m = JS_VALUE_GET_PTR(func_val);

    module_name_atom = JS_GetModuleName(ctx, m);
    module_name = JS_AtomToCString(ctx, module_name_atom);
    JS_FreeAtom(ctx, module_name_atom);
    if (!module_name)
        return -1;
    if (!strchr(module_name, ':')) {
        strcpy(buf, "file://");
#if !defined(_WIN32)
        /* realpath() cannot be used with modules compiled with qjsc
           because the corresponding module source code is not
           necessarily present */
        if (use_realpath) {
            char *res = realpath(module_name, buf + strlen(buf));
            if (!res) {
                JS_ThrowTypeError(ctx, "realpath failure");
                JS_FreeCString(ctx, module_name);
                return -1;
            }
        } else
#endif
        {
            pstrcat(buf, sizeof(buf), module_name);
        }
    } else {
        pstrcpy(buf, sizeof(buf), module_name);
    }
    JS_FreeCString(ctx, module_name);
    
    meta_obj = JS_GetImportMeta(ctx, m);
    if (JS_IsException(meta_obj))
        return -1;
    JS_DefinePropertyValueStr(ctx, meta_obj, "url",
                              JS_NewString(ctx, buf),
                              JS_PROP_C_W_E);
    JS_DefinePropertyValueStr(ctx, meta_obj, "main",
                              JS_NewBool(ctx, is_main),
                              JS_PROP_C_W_E);
    JS_FreeValue(ctx, meta_obj);
    return 0;
}